

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O1

void VP8EncInitAlpha(VP8Encoder *enc)

{
  int iVar1;
  WebPWorkerInterface *pWVar2;
  
  WebPInitAlphaProcessing();
  iVar1 = WebPPictureHasTransparency(enc->pic);
  enc->has_alpha = iVar1;
  enc->alpha_data = (uint8_t *)0x0;
  enc->alpha_data_size = 0;
  if (0 < enc->thread_level) {
    pWVar2 = WebPGetWorkerInterface();
    (*pWVar2->Init)(&enc->alpha_worker);
    (enc->alpha_worker).data1 = enc;
    (enc->alpha_worker).data2 = (void *)0x0;
    (enc->alpha_worker).hook = CompressAlphaJob;
  }
  return;
}

Assistant:

void VP8EncInitAlpha(VP8Encoder* const enc) {
  WebPInitAlphaProcessing();
  enc->has_alpha = WebPPictureHasTransparency(enc->pic);
  enc->alpha_data = NULL;
  enc->alpha_data_size = 0;
  if (enc->thread_level > 0) {
    WebPWorker* const worker = &enc->alpha_worker;
    WebPGetWorkerInterface()->Init(worker);
    worker->data1 = enc;
    worker->data2 = NULL;
    worker->hook = CompressAlphaJob;
  }
}